

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.hpp
# Opt level: O0

request diy::mpi::detail::isend<std::vector<char,std::allocator<char>>>
                  (DIY_MPI_Comm comm,int dest,int tag,vector<char,_std::allocator<char>_> *x)

{
  request rVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  DIY_MPI_Comm in_stack_00000008;
  undefined4 uVar2;
  undefined4 uVar3;
  int count;
  void *in_stack_fffffffffffffff8;
  
  count = (int)((ulong)in_RDI >> 0x20);
  uVar2 = in_EDX;
  uVar3 = in_ESI;
  address<std::vector<char,std::allocator<char>>>((vector<char,_std::allocator<char>_> *)0x180a39);
  count<std::vector<char,std::allocator<char>>>((vector<char,_std::allocator<char>_> *)0x180a48);
  datatype_of<std::vector<char,std::allocator<char>>>
            ((vector<char,_std::allocator<char>_> *)CONCAT44(in_EDX,in_ESI));
  rVar1 = isend(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffff8,count,
                (datatype *)CONCAT44(uVar3,uVar2));
  return (request)rVar1.handle.data.data;
}

Assistant:

request isend(DIY_MPI_Comm comm, int dest, int tag, const T& x)
  {
    static_assert(std::is_same<typename is_mpi_datatype<T>::type, true_type>::value, "is_mpi_datatype<T>::type must be true_type");
    return isend(comm, dest, tag, address(x), count(x), datatype_of(x));
  }